

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

S2Point * __thiscall
S2Builder::GetSeparationSite
          (S2Point *__return_storage_ptr__,S2Builder *this,S2Point *site_to_avoid,S2Point *v0,
          S2Point *v1,InputEdgeId input_edge_id)

{
  int iVar1;
  int iVar2;
  pointer pVVar3;
  pointer ppVar4;
  double dVar5;
  VType VVar6;
  BasicVector<Vector3,_double,_3UL> *this_00;
  bool bVar7;
  S2Point *pSVar8;
  Vector3_d *y;
  S2Point local_c8;
  BasicVector<Vector3,_double,_3UL> *local_b0;
  S2Point gap_max;
  undefined1 local_88 [16];
  double local_78;
  S2Point gap_min;
  S2Point n;
  
  pVVar3 = (this->input_vertices_).
           super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar4 = (this->input_edges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = ppVar4[input_edge_id].first;
  iVar2 = ppVar4[input_edge_id].second;
  pSVar8 = pVVar3 + iVar2;
  local_78 = pVVar3[iVar2].c_[2] - pVVar3[iVar1].c_[2];
  dVar5 = pVVar3[iVar2].c_[1] - pVVar3[iVar1].c_[1];
  local_88._8_4_ = SUB84(dVar5,0);
  local_88._0_8_ = pVVar3[iVar2].c_[0] - pVVar3[iVar1].c_[0];
  local_88._12_4_ = (int)((ulong)dVar5 >> 0x20);
  local_b0 = (BasicVector<Vector3,_double,_3UL> *)v1;
  S2::RobustCrossProd(&n,pVVar3 + iVar1,pSVar8);
  this_00 = local_b0;
  y = &n;
  S2::Project(__return_storage_ptr__,site_to_avoid,pVVar3 + iVar1,pSVar8,&n);
  GetCoverageEndpoint(&gap_min,this,v0,pSVar8,y,&n);
  local_c8.c_[0] = -(double)CONCAT44(n.c_[0]._4_4_,n.c_[0]._0_4_);
  local_c8.c_[1]._0_4_ = n.c_[1]._0_4_;
  local_c8.c_[1]._4_4_ = n.c_[1]._4_4_ ^ 0x80000000;
  local_c8.c_[2] = -n.c_[2];
  GetCoverageEndpoint(&gap_max,this,(S2Point *)this_00,pSVar8,y,&local_c8);
  local_c8.c_[2] = __return_storage_ptr__->c_[2] - gap_min.c_[2];
  dVar5 = __return_storage_ptr__->c_[1] - gap_min.c_[1];
  local_c8.c_[1]._0_4_ = SUB84(dVar5,0);
  local_c8.c_[0] = __return_storage_ptr__->c_[0] - gap_min.c_[0];
  local_c8.c_[1]._4_4_ = (int)((ulong)dVar5 >> 0x20);
  dVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                    ((BasicVector<Vector3,_double,_3UL> *)&local_c8,(D *)local_88);
  pSVar8 = &gap_min;
  if (0.0 <= dVar5) {
    local_c8.c_[2] = gap_max.c_[2] - __return_storage_ptr__->c_[2];
    dVar5 = gap_max.c_[1] - __return_storage_ptr__->c_[1];
    local_c8.c_[1]._0_4_ = SUB84(dVar5,0);
    local_c8.c_[0] = gap_max.c_[0] - __return_storage_ptr__->c_[0];
    local_c8.c_[1]._4_4_ = (int)((ulong)dVar5 >> 0x20);
    dVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                      ((BasicVector<Vector3,_double,_3UL> *)&local_c8,(D *)local_88);
    pSVar8 = &gap_max;
    if (0.0 <= dVar5) goto LAB_001f2a3f;
  }
  __return_storage_ptr__->c_[2] = pSVar8->c_[2];
  VVar6 = pSVar8->c_[1];
  __return_storage_ptr__->c_[0] = pSVar8->c_[0];
  __return_storage_ptr__->c_[1] = VVar6;
LAB_001f2a3f:
  SnapSite(&local_c8,this,__return_storage_ptr__);
  __return_storage_ptr__->c_[2] = local_c8.c_[2];
  __return_storage_ptr__->c_[0] = local_c8.c_[0];
  __return_storage_ptr__->c_[1] = local_c8.c_[1];
  bVar7 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                    ((BasicVector<Vector3,_double,_3UL> *)v0,__return_storage_ptr__);
  if (bVar7) {
    bVar7 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                      (this_00,__return_storage_ptr__);
    if (bVar7) {
      return __return_storage_ptr__;
    }
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0x393,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)local_c8.c_[1],"Check failed: (v1) != (new_site) ");
  }
  else {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0x392,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)local_c8.c_[1],"Check failed: (v0) != (new_site) ");
  }
  abort();
}

Assistant:

S2Point S2Builder::GetSeparationSite(const S2Point& site_to_avoid,
                                     const S2Point& v0, const S2Point& v1,
                                     InputEdgeId input_edge_id) const {
  // Define the "coverage disc" of a site S to be the disc centered at S with
  // radius "snap_radius".  Similarly, define the "coverage interval" of S for
  // an edge XY to be the intersection of XY with the coverage disc of S.  The
  // SnapFunction implementations guarantee that the only way that a snapped
  // edge can be closer than min_edge_vertex_separation() to a non-snapped
  // site (i.e., site_to_avoid) if is there is a gap in the coverage of XY
  // near this site.  We can fix this problem simply by adding a new site to
  // fill this gap, located as closely as possible to the site to avoid.
  //
  // To calculate the coverage gap, we look at the two snapped sites on
  // either side of site_to_avoid, and find the endpoints of their coverage
  // intervals.  The we place a new site in the gap, located as closely as
  // possible to the site to avoid.  Note that the new site may move when it
  // is snapped by the snap_function, but it is guaranteed not to move by
  // more than snap_radius and therefore its coverage interval will still
  // intersect the gap.
  const InputEdge& edge = input_edges_[input_edge_id];
  const S2Point& x = input_vertices_[edge.first];
  const S2Point& y = input_vertices_[edge.second];
  Vector3_d xy_dir = y - x;
  S2Point n = S2::RobustCrossProd(x, y);
  S2Point new_site = S2::Project(site_to_avoid, x, y, n);
  S2Point gap_min = GetCoverageEndpoint(v0, x, y, n);
  S2Point gap_max = GetCoverageEndpoint(v1, y, x, -n);
  if ((new_site - gap_min).DotProd(xy_dir) < 0) {
    new_site = gap_min;
  } else if ((gap_max - new_site).DotProd(xy_dir) < 0) {
    new_site = gap_max;
  }
  new_site = SnapSite(new_site);
  S2_DCHECK_NE(v0, new_site);
  S2_DCHECK_NE(v1, new_site);
  return new_site;
}